

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandPrintDelay(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pIn;
  char *pcVar3;
  char *format;
  Abc_Obj_t *pOut;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 != -1) {
LAB_0024e96b:
    Abc_Print(-2,"usage: print_delay [-h] <CO_name> <CI_name>\n");
    Abc_Print(-2,"\t            prints one critical path of the mapped network\n");
    Abc_Print(-2,"\t-h        : print the command usage\n");
    Abc_Print(-2,
              "\t<CO_name> : (optional) the sink of the critical path (primary output or flop input)\n"
             );
    Abc_Print(-2,
              "\t<CI_name> : (optional) the source of the critical path (primary input or flop output)\n"
             );
    pcVar3 = "\t            (if CO and/or CI are not given, uses the most critical ones)\n";
    iVar1 = -2;
    goto LAB_0024ea29;
  }
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else {
    if ((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
      if (globalUtilOptind + 2 < argc) {
        Abc_Print(-1,"Wrong number of auguments.\n");
        goto LAB_0024e96b;
      }
      if (globalUtilOptind < argc) {
        uVar2 = Nm_ManFindIdByName(pNtk->pManName,argv[globalUtilOptind],3);
        if ((-1 < (int)uVar2) ||
           (uVar2 = Nm_ManFindIdByName(pNtk->pManName,argv[globalUtilOptind],4), -1 < (int)uVar2)) {
          if (pNtk->vObjs->nSize <= (int)uVar2) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pOut = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar2];
          if (pOut != (Abc_Obj_t *)0x0) goto LAB_0024eaab;
        }
        pcVar3 = argv[globalUtilOptind];
        format = "Cannot find combinational output \"%s\".\n";
LAB_0024eb34:
        Abc_Print(1,format,pcVar3);
        return 1;
      }
      pOut = (Abc_Obj_t *)0x0;
LAB_0024eaab:
      if (globalUtilOptind + 2 == argc) {
        iVar1 = Nm_ManFindIdByName(pNtk->pManName,argv[(long)globalUtilOptind + 1],2);
        if (((iVar1 < 0) &&
            (iVar1 = Nm_ManFindIdByName(pNtk->pManName,argv[(long)globalUtilOptind + 1],5),
            iVar1 < 0)) ||
           (pIn = Abc_NtkObj((Abc_Ntk_t *)pNtk->vObjs,iVar1), pIn == (Abc_Obj_t *)0x0)) {
          pcVar3 = argv[(long)globalUtilOptind + 1];
          format = "Cannot find combinational input \"%s\".\n";
          goto LAB_0024eb34;
        }
      }
      else {
        pIn = (Abc_Obj_t *)0x0;
      }
      Abc_NtkDelayTrace(pNtk,pOut,pIn,1);
      return 0;
    }
    pcVar3 = "Delay trace works only for network mapped into standard cells.\n";
  }
  iVar1 = -1;
LAB_0024ea29:
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandPrintDelay( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pObjIn = NULL, * pObjOut = NULL;
    int c;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsMappedLogic(pNtk) )
    {
        Abc_Print( -1, "Delay trace works only for network mapped into standard cells.\n" );
        return 1;
    }
    if ( argc > globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    // collect the first name (PO name)
    if ( argc >= globalUtilOptind + 1 )
    {
        int Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind], ABC_OBJ_PO );
        if ( Num < 0 )
            Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind], ABC_OBJ_BI );
        if ( Num >= 0 )
            pObjOut = Abc_NtkObj( pNtk, Num );
        if ( pObjOut == NULL )
        {
            Abc_Print( 1, "Cannot find combinational output \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    // collect the second name (PI name)
    if ( argc == globalUtilOptind + 2 )
    {
        int Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind+1], ABC_OBJ_PI );
        if ( Num < 0 )
            Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind+1], ABC_OBJ_BO );
        if ( Num >= 0 )
            pObjIn = Abc_NtkObj( pNtk, Num );
        if ( pObjIn == NULL )
        {
            Abc_Print( 1, "Cannot find combinational input \"%s\".\n", argv[globalUtilOptind+1] );
            return 1;
        }
    }
    Abc_NtkDelayTrace( pNtk, pObjOut, pObjIn, 1 );
    return 0;

usage:
    Abc_Print( -2, "usage: print_delay [-h] <CO_name> <CI_name>\n" );
    Abc_Print( -2, "\t            prints one critical path of the mapped network\n" );
    Abc_Print( -2, "\t-h        : print the command usage\n");
    Abc_Print( -2, "\t<CO_name> : (optional) the sink of the critical path (primary output or flop input)\n");
    Abc_Print( -2, "\t<CI_name> : (optional) the source of the critical path (primary input or flop output)\n");
    Abc_Print( -2, "\t            (if CO and/or CI are not given, uses the most critical ones)\n");
    return 1;
}